

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O1

int language::formatEscapedNumber(QTextStream *str,ushort value,int base,int width,char prefix)

{
  int iVar1;
  FieldAlignment FVar2;
  
  QTextStream::operator<<(str,'\\');
  if (prefix == '\0') {
    iVar1 = width + 1;
  }
  else {
    QTextStream::operator<<(str,prefix);
    iVar1 = width + 2;
  }
  QTextStream::padChar();
  QTextStream::fieldWidth();
  QTextStream::fieldAlignment();
  QTextStream::integerBase();
  QTextStream::setPadChar((QChar)(char16_t)str);
  FVar2 = (FieldAlignment)str;
  QTextStream::setFieldWidth(FVar2);
  QTextStream::setFieldAlignment(FVar2);
  QTextStream::setIntegerBase(FVar2);
  QTextStream::operator<<(str,value);
  QTextStream::setIntegerBase(FVar2);
  QTextStream::setFieldAlignment(FVar2);
  QTextStream::setFieldWidth(FVar2);
  QTextStream::setPadChar((QChar)(char16_t)str);
  return iVar1;
}

Assistant:

static int formatEscapedNumber(QTextStream &str, ushort value, int base, int width,
                               char prefix = 0)
{
    int length = 1 + width;
    str << '\\';
    if (prefix) {
        str << prefix;
        ++length;
    }
    const auto oldPadChar = str.padChar();
    const auto oldFieldWidth = str.fieldWidth();
    const auto oldFieldAlignment = str.fieldAlignment();
    const auto oldIntegerBase = str.integerBase();
    str.setPadChar(u'0');
    str.setFieldWidth(width);
    str.setFieldAlignment(QTextStream::AlignRight);
    str.setIntegerBase(base);
    str << value;
    str.setIntegerBase(oldIntegerBase);
    str.setFieldAlignment(oldFieldAlignment);
    str.setFieldWidth(oldFieldWidth);
    str.setPadChar(oldPadChar);
    return length;
}